

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::SerializeWithCachedSizes
          (VisionFeaturePrint *this,CodedOutputStream *output)

{
  if (this->_oneof_case_[0] == 0x14) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&((this->VisionFeaturePrintType_).scene_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x15) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&((this->VisionFeaturePrintType_).scene_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void VisionFeaturePrint::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
  if (has_scene()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *VisionFeaturePrintType_.scene_, output);
  }

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
  if (has_objects()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *VisionFeaturePrintType_.objects_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
}